

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void initAvgEq(Index *pIdx)

{
  int iVar1;
  uint uVar2;
  IndexSample *pIVar3;
  uint *puVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  if (pIdx != (Index *)0x0) {
    pIVar3 = pIdx->aSample;
    iVar1 = pIdx->nSample;
    if (pIdx->nSampleCol < 2) {
      uVar11 = 1;
    }
    else {
      uVar11 = (ulong)(pIdx->nSampleCol - 1);
      pIdx->aAvgEq[uVar11] = 1;
    }
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      uVar2 = pIdx->nSample;
      puVar4 = pIdx->aiRowEst;
      if (((puVar4 == (uint *)0x0) || (pIdx->nKeyCol <= uVar12)) || ((ulong)puVar4[uVar12 + 1] == 0)
         ) {
        uVar13 = pIVar3[(long)iVar1 + -1].anLt[uVar12];
        uVar7 = (ulong)pIVar3[(long)iVar1 + -1].anDLt[uVar12] * 100;
        uVar10 = uVar2 - 1;
      }
      else {
        uVar13 = *puVar4;
        uVar7 = ((ulong)uVar13 * 100) / (ulong)puVar4[uVar12 + 1];
        uVar10 = uVar2;
      }
      pIdx->nRowEst0 = uVar13;
      lVar8 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      uVar9 = 0;
      lVar14 = 0;
      for (; (ulong)uVar10 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
        if (((ulong)(uVar2 - 1) * 0x28 - lVar8 == 0) ||
           (*(int *)(*(long *)((long)&pIVar3->anDLt + lVar8) + uVar12 * 4) !=
            *(int *)(*(long *)((long)&pIVar3[1].anDLt + lVar8) + uVar12 * 4))) {
          uVar9 = uVar9 + *(int *)(*(long *)((long)&pIVar3->anEq + lVar8) + uVar12 * 4);
          lVar14 = lVar14 + 100;
        }
      }
      iVar6 = 0;
      if ((uVar7 - lVar14 != 0 && lVar14 <= (long)uVar7) && (uVar9 <= uVar13 && uVar13 - uVar9 != 0)
         ) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (ulong)(uVar13 - uVar9) * 100;
        iVar6 = SUB164(auVar5 / SEXT816((long)(uVar7 - lVar14)),0);
      }
      pIdx->aAvgEq[uVar12] = iVar6 + (uint)(iVar6 == 0);
    }
  }
  return;
}

Assistant:

static void initAvgEq(Index *pIdx){
  if( pIdx ){
    IndexSample *aSample = pIdx->aSample;
    IndexSample *pFinal = &aSample[pIdx->nSample-1];
    int iCol;
    int nCol = 1;
    if( pIdx->nSampleCol>1 ){
      /* If this is stat4 data, then calculate aAvgEq[] values for all
      ** sample columns except the last. The last is always set to 1, as
      ** once the trailing PK fields are considered all index keys are
      ** unique.  */
      nCol = pIdx->nSampleCol-1;
      pIdx->aAvgEq[nCol] = 1;
    }
    for(iCol=0; iCol<nCol; iCol++){
      int nSample = pIdx->nSample;
      int i;                    /* Used to iterate through samples */
      tRowcnt sumEq = 0;        /* Sum of the nEq values */
      tRowcnt avgEq = 0;
      tRowcnt nRow;             /* Number of rows in index */
      i64 nSum100 = 0;          /* Number of terms contributing to sumEq */
      i64 nDist100;             /* Number of distinct values in index */

      if( !pIdx->aiRowEst || iCol>=pIdx->nKeyCol || pIdx->aiRowEst[iCol+1]==0 ){
        nRow = pFinal->anLt[iCol];
        nDist100 = (i64)100 * pFinal->anDLt[iCol];
        nSample--;
      }else{
        nRow = pIdx->aiRowEst[0];
        nDist100 = ((i64)100 * pIdx->aiRowEst[0]) / pIdx->aiRowEst[iCol+1];
      }
      pIdx->nRowEst0 = nRow;

      /* Set nSum to the number of distinct (iCol+1) field prefixes that
      ** occur in the stat4 table for this index. Set sumEq to the sum of 
      ** the nEq values for column iCol for the same set (adding the value 
      ** only once where there exist duplicate prefixes).  */
      for(i=0; i<nSample; i++){
        if( i==(pIdx->nSample-1)
         || aSample[i].anDLt[iCol]!=aSample[i+1].anDLt[iCol] 
        ){
          sumEq += aSample[i].anEq[iCol];
          nSum100 += 100;
        }
      }

      if( nDist100>nSum100 && sumEq<nRow ){
        avgEq = ((i64)100 * (nRow - sumEq))/(nDist100 - nSum100);
      }
      if( avgEq==0 ) avgEq = 1;
      pIdx->aAvgEq[iCol] = avgEq;
    }
  }
}